

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O0

long __thiscall
gl4cts::anon_unknown_0::AdvancedWriteTessellation::Run(AdvancedWriteTessellation *this)

{
  bool bVar1;
  GLuint GVar2;
  int w;
  int h;
  float *pfVar3;
  __0 *local_260;
  undefined1 local_218 [8];
  vec4 p;
  int i;
  __0 local_1f8 [8];
  anon_struct_32_3_caea0a8d data [6];
  uvec4 zero;
  float data_1 [8];
  string local_100;
  allocator<char> local_d9;
  string local_d8;
  allocator<char> local_b1;
  string local_b0;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_51;
  string local_50;
  char *local_30;
  char *glsl_fs;
  char *glsl_tes;
  char *glsl_vs;
  AdvancedWriteTessellation *this_local;
  
  glsl_vs = (char *)this;
  bVar1 = ShaderStorageBufferObjectBase::SupportedInTES
                    (&this->super_ShaderStorageBufferObjectBase,1);
  if (bVar1) {
    glsl_tes = 
    "\nlayout(location = 0) in vec4 g_in_position;\nvoid main() {\n  gl_Position = g_in_position;\n}"
    ;
    glsl_fs = 
    "\nlayout(quads) in;\nstruct VertexData {\n  int valid;\n  vec4 position;\n};\nlayout(std430, binding = 2) buffer VertexBuffer {\n  VertexData g_vertex_buffer[];\n};\nlayout(binding = 2, offset = 0) uniform atomic_uint g_vertex_counter;\nvoid main() {\n  const uint idx = atomicCounterIncrement(g_vertex_counter);\n  vec4 p0 = mix(gl_in[0].gl_Position, gl_in[1].gl_Position, gl_TessCoord.x);\n  vec4 p1 = mix(gl_in[3].gl_Position, gl_in[2].gl_Position, gl_TessCoord.x);\n  vec4 p = mix(p0, p1, gl_TessCoord.y);\n  g_vertex_buffer[idx].position = p;\n  g_vertex_buffer[idx].valid = 1;\n  gl_Position = g_vertex_buffer[idx].position;\n}"
    ;
    local_30 = 
    "\nlayout(location = 0) out vec4 g_fs_out;\nvoid main() {\n  g_fs_out = vec4(0, 1, 0, 1);\n}";
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,
               "\nlayout(location = 0) in vec4 g_in_position;\nvoid main() {\n  gl_Position = g_in_position;\n}"
               ,&local_51);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"",&local_89);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,
               "\nlayout(quads) in;\nstruct VertexData {\n  int valid;\n  vec4 position;\n};\nlayout(std430, binding = 2) buffer VertexBuffer {\n  VertexData g_vertex_buffer[];\n};\nlayout(binding = 2, offset = 0) uniform atomic_uint g_vertex_counter;\nvoid main() {\n  const uint idx = atomicCounterIncrement(g_vertex_counter);\n  vec4 p0 = mix(gl_in[0].gl_Position, gl_in[1].gl_Position, gl_TessCoord.x);\n  vec4 p1 = mix(gl_in[3].gl_Position, gl_in[2].gl_Position, gl_TessCoord.x);\n  vec4 p = mix(p0, p1, gl_TessCoord.y);\n  g_vertex_buffer[idx].position = p;\n  g_vertex_buffer[idx].valid = 1;\n  gl_Position = g_vertex_buffer[idx].position;\n}"
               ,&local_b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"",&local_d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,
               "\nlayout(location = 0) out vec4 g_fs_out;\nvoid main() {\n  g_fs_out = vec4(0, 1, 0, 1);\n}"
               ,(allocator<char> *)((long)data_1 + 0x1f));
    GVar2 = ShaderStorageBufferObjectBase::CreateProgram
                      (&this->super_ShaderStorageBufferObjectBase,&local_50,&local_88,&local_b0,
                       &local_d8,&local_100);
    this->m_program = GVar2;
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator((allocator<char> *)((long)data_1 + 0x1f));
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator(&local_d9);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    glu::CallLogWrapper::glLinkProgram
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
    bVar1 = ShaderStorageBufferObjectBase::CheckProgram
                      (&this->super_ShaderStorageBufferObjectBase,this->m_program);
    if (bVar1) {
      zero.m_data[2] = 0xbf800000;
      zero.m_data[3] = 0xbf800000;
      data_1[0] = 1.0;
      data_1[1] = -1.0;
      data_1[2] = 1.0;
      data_1[3] = 1.0;
      data_1[4] = -1.0;
      data_1[5] = 1.0;
      glu::CallLogWrapper::glGenBuffers
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,&this->m_vertex_buffer);
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8892,this->m_vertex_buffer);
      glu::CallLogWrapper::glBufferData
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8892,0x20,zero.m_data + 2,0x88e4);
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8892,0);
      glu::CallLogWrapper::glGenBuffers
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,&this->m_counter_buffer);
      glu::CallLogWrapper::glBindBufferBase
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x92c0,2,this->m_counter_buffer);
      glu::CallLogWrapper::glBufferData
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x92c0,4,(void *)0x0,0x88e8);
      tcu::Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)(data[5].position.m_data + 2))
      ;
      glu::CallLogWrapper::glBufferSubData
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x92c0,0,4,data[5].position.m_data + 2);
      local_260 = local_1f8;
      do {
        gl4cts::(anonymous_namespace)::AdvancedWriteTessellation::Run()::$_0::__0(local_260);
        local_260 = local_260 + 0x20;
      } while (local_260 != (__0 *)(data[5].position.m_data + 2));
      memset(local_1f8,0,0xc0);
      glu::CallLogWrapper::glGenBuffers
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,&this->m_storage_buffer);
      glu::CallLogWrapper::glBindBufferBase
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,2,this->m_storage_buffer);
      glu::CallLogWrapper::glBufferData
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0xc0,local_1f8,0x88e8);
      glu::CallLogWrapper::glGenVertexArrays
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,&this->m_vertex_array);
      glu::CallLogWrapper::glBindVertexArray
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_vertex_array);
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8892,this->m_vertex_buffer);
      glu::CallLogWrapper::glVertexAttribPointer
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0,2,0x1406,'\0',0,(void *)0x0);
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8892,0);
      glu::CallLogWrapper::glEnableVertexAttribArray
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0);
      glu::CallLogWrapper::glBindVertexArray
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0);
      glu::CallLogWrapper::glClear
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x4000);
      glu::CallLogWrapper::glUseProgram
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_program);
      glu::CallLogWrapper::glBindVertexArray
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_vertex_array);
      glu::CallLogWrapper::glPatchParameteri
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8e72,4);
      glu::CallLogWrapper::glDrawArrays
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0xe,0,4);
      w = ShaderStorageBufferObjectBase::getWindowWidth(&this->super_ShaderStorageBufferObjectBase);
      h = ShaderStorageBufferObjectBase::getWindowHeight(&this->super_ShaderStorageBufferObjectBase)
      ;
      tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(p.m_data + 3),0.0,1.0,0.0);
      bVar1 = ShaderStorageBufferObjectBase::ValidateReadBuffer
                        (&this->super_ShaderStorageBufferObjectBase,0,0,w,h,(vec3 *)(p.m_data + 3));
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        glu::CallLogWrapper::glMemoryBarrier
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x200);
        glu::CallLogWrapper::glGetBufferSubData
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90d2,0,0xc0,local_1f8);
        for (p.m_data[2] = 0.0; (int)p.m_data[2] < 4; p.m_data[2] = (float)((int)p.m_data[2] + 1)) {
          tcu::Vector<float,_4>::Vector
                    ((Vector<float,_4> *)local_218,
                     (Vector<float,_4> *)(data[(int)p.m_data[2]].pad + 1));
          pfVar3 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_218,2);
          if ((*pfVar3 != 0.0) || (NAN(*pfVar3))) {
LAB_00ff1863:
            return (long)&DAT_ffffffffffffffff;
          }
          pfVar3 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_218,3);
          if ((*pfVar3 != 1.0) || (NAN(*pfVar3))) goto LAB_00ff1863;
          if (data[(long)(int)p.m_data[2] + -1].position.m_data[2] != 1.4013e-45) {
            return (long)&DAT_ffffffffffffffff;
          }
        }
        this_local = (AdvancedWriteTessellation *)0x0;
      }
      else {
        this_local = (AdvancedWriteTessellation *)&DAT_ffffffffffffffff;
      }
    }
    else {
      this_local = (AdvancedWriteTessellation *)&DAT_ffffffffffffffff;
    }
  }
  else {
    this_local = (AdvancedWriteTessellation *)0x10;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInTES(1))
			return NOT_SUPPORTED;

		const char* const glsl_vs = NL "layout(location = 0) in vec4 g_in_position;" NL "void main() {" NL
									   "  gl_Position = g_in_position;" NL "}";

		const char* const glsl_tes =
			NL "layout(quads) in;" NL "struct VertexData {" NL "  int valid;" NL "  vec4 position;" NL "};" NL
			   "layout(std430, binding = 2) buffer VertexBuffer {" NL "  VertexData g_vertex_buffer[];" NL "};" NL
			   "layout(binding = 2, offset = 0) uniform atomic_uint g_vertex_counter;" NL "void main() {" NL
			   "  const uint idx = atomicCounterIncrement(g_vertex_counter);" NL
			   "  vec4 p0 = mix(gl_in[0].gl_Position, gl_in[1].gl_Position, gl_TessCoord.x);" NL
			   "  vec4 p1 = mix(gl_in[3].gl_Position, gl_in[2].gl_Position, gl_TessCoord.x);" NL
			   "  vec4 p = mix(p0, p1, gl_TessCoord.y);" NL "  g_vertex_buffer[idx].position = p;" NL
			   "  g_vertex_buffer[idx].valid = 1;" NL "  gl_Position = g_vertex_buffer[idx].position;" NL "}";

		const char* const glsl_fs =
			NL "layout(location = 0) out vec4 g_fs_out;" NL "void main() {" NL "  g_fs_out = vec4(0, 1, 0, 1);" NL "}";

		m_program = CreateProgram(glsl_vs, "", glsl_tes, "", glsl_fs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		/* vertex buffer */
		{
			const float data[] = { -1, -1, 1, -1, 1, 1, -1, 1 };
			glGenBuffers(1, &m_vertex_buffer);
			glBindBuffer(GL_ARRAY_BUFFER, m_vertex_buffer);
			glBufferData(GL_ARRAY_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
			glBindBuffer(GL_ARRAY_BUFFER, 0);
		}

		glGenBuffers(1, &m_counter_buffer);
		glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 2, m_counter_buffer);
		glBufferData(GL_ATOMIC_COUNTER_BUFFER, 4, NULL, GL_DYNAMIC_DRAW);
		uvec4 zero;
		glBufferSubData(GL_ATOMIC_COUNTER_BUFFER, 0, 4, &zero);

		struct
		{
			int  valid;
			int  pad[3];
			vec4 position;
		} data[6];
		memset(data, 0, sizeof(data));
		glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 2, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_DRAW);

		glGenVertexArrays(1, &m_vertex_array);
		glBindVertexArray(m_vertex_array);
		glBindBuffer(GL_ARRAY_BUFFER, m_vertex_buffer);
		glVertexAttribPointer(0, 2, GL_FLOAT, GL_FALSE, 0, 0);
		glBindBuffer(GL_ARRAY_BUFFER, 0);
		glEnableVertexAttribArray(0);
		glBindVertexArray(0);

		glClear(GL_COLOR_BUFFER_BIT);
		glUseProgram(m_program);
		glBindVertexArray(m_vertex_array);
		glPatchParameteri(GL_PATCH_VERTICES, 4);
		glDrawArrays(GL_PATCHES, 0, 4);
		if (!ValidateReadBuffer(0, 0, getWindowWidth(), getWindowHeight(), vec3(0, 1, 0)))
		{
			return ERROR;
		}

		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), data);
		for (int i = 0; i < 4; ++i)
		{
			vec4 p = data[i].position;
			if (p[2] != 0.0f || p[3] != 1.0f)
				return ERROR;
			if (data[i].valid != 1)
				return ERROR;
		}

		return NO_ERROR;
	}